

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::ZoneStackBase::_prepareBlock(ZoneStackBase *this,uint32_t side,size_t initialIndex)

{
  ZoneAllocator *this_00;
  long lVar1;
  void *pvVar2;
  ulong uVar3;
  size_t local_30;
  
  this_00 = *(ZoneAllocator **)this;
  if (this_00 == (ZoneAllocator *)0x0) {
    _prepareBlock();
  }
  else {
    uVar3 = (ulong)side;
    lVar1 = *(long *)(this + uVar3 * 8 + 8);
    if (*(long *)(lVar1 + 0x10) != *(long *)(lVar1 + 0x18)) {
      if (*(long *)this_00 != 0) {
        pvVar2 = ZoneAllocator::_alloc(this_00,0x200,&local_30);
        if (pvVar2 == (void *)0x0) {
          return 1;
        }
        *(undefined8 *)((long)pvVar2 + uVar3 * 8) = 0;
        *(long *)((long)pvVar2 + (ulong)(side == 0) * 8) = lVar1;
        *(size_t *)((long)pvVar2 + 0x10) = initialIndex + (long)pvVar2;
        *(size_t *)((long)pvVar2 + 0x18) = initialIndex + (long)pvVar2;
        *(void **)(lVar1 + uVar3 * 8) = pvVar2;
        *(void **)(this + uVar3 * 8 + 8) = pvVar2;
        return 0;
      }
      goto LAB_0012af22;
    }
  }
  _prepareBlock();
LAB_0012af22:
  _prepareBlock();
  return 1;
}

Assistant:

Error ZoneStackBase::_prepareBlock(uint32_t side, size_t initialIndex) noexcept {
  ASMJIT_ASSERT(isInitialized());

  Block* prev = _block[side];
  ASMJIT_ASSERT(!prev->empty());

  Block* block = _allocator->allocT<Block>(kBlockSize);
  if (ASMJIT_UNLIKELY(!block))
    return DebugUtils::errored(kErrorOutOfMemory);

  block->_link[ side] = nullptr;
  block->_link[!side] = prev;
  block->_start = (uint8_t*)block + initialIndex;
  block->_end = (uint8_t*)block + initialIndex;

  prev->_link[side] = block;
  _block[side] = block;

  return kErrorOk;
}